

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

uint Abc_NtkPowerCriticalEdges(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,float Limit,Vec_Int_t *vProbs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = (pNode->vFanins).nSize;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  uVar1 = 0;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar4 = 1 << ((byte)uVar2 & 0x1f);
    if ((float)vProbs->pArray
               [*(int *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar2]] + 0x10)] <
        Limit) {
      uVar4 = 0;
    }
    uVar1 = uVar1 | uVar4;
  }
  return uVar1;
}

Assistant:

unsigned Abc_NtkPowerCriticalEdges( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, float Limit, Vec_Int_t * vProbs )
{
    Abc_Obj_t * pFanin;
    float * pProb = (float *)vProbs->pArray;
    unsigned uResult = 0;
    int k;
    Abc_ObjForEachFanin( pNode, pFanin, k )
        if ( pProb[pFanin->Id] >= Limit )
            uResult |= (1 << k);
    return uResult;
}